

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

void nls(nls_object obj,custom_funcmult *funcmult,custom_jacobian *jacobian,double *xi)

{
  int N;
  int iVar1;
  double *fvec;
  double *fjac;
  double *diag;
  double *qtf;
  int *ipvt;
  long lVar2;
  long lVar3;
  
  iVar1 = obj->M;
  N = obj->N;
  lVar3 = (long)N;
  fvec = (double *)malloc((long)iVar1 * 8);
  fjac = (double *)malloc((long)iVar1 * 8 * lVar3);
  diag = (double *)malloc(lVar3 * 8);
  qtf = (double *)malloc(lVar3 * 8);
  ipvt = (int *)malloc(lVar3 * 4);
  if (0 < lVar3) {
    lVar2 = 0;
    do {
      obj->xopt[lVar2] = xi[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  if (jacobian == (custom_jacobian *)0x0) {
    iVar1 = lmdif(funcmult,obj->xopt,iVar1,N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,obj->mode,
                  obj->factor,0,obj->eps,obj->epsfcn,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,
                  &obj->njev,ipvt,qtf);
  }
  else {
    iVar1 = lmder(funcmult,jacobian,obj->xopt,iVar1,N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,
                  obj->mode,obj->factor,0,obj->eps,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,
                  &obj->njev,ipvt,qtf);
  }
  obj->retval = iVar1;
  obj->Iter = obj->nfev;
  free(fvec);
  free(fjac);
  free(diag);
  free(qtf);
  free(ipvt);
  return;
}

Assistant:

void nls(nls_object obj, custom_funcmult *funcmult, custom_jacobian *jacobian,
		double *xi) {

	int info,i,M,N,nprint;
	double *fvec,*fjac,*diag,*qtf;
	int *ipvt;

	M = obj->M;
	N = obj-> N;
	nprint = 0;

	fvec = (double*) malloc(sizeof(double) *M);
	fjac = (double*) malloc(sizeof(double) *M * N);
	diag = (double*) malloc(sizeof(double) *N);
	qtf = (double*) malloc(sizeof(double) *N);
	ipvt = (int*) malloc(sizeof(int) *N);

	for(i = 0; i < N;++i) {
		obj->xopt[i] = xi[i];
	}

	if (jacobian == NULL) {
		info = lmdif(funcmult,obj->xopt,obj->M,obj->N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,obj->mode,
				obj->factor,nprint,obj->eps,obj->epsfcn,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,&obj->njev,ipvt,qtf);
	} else {
		info = lmder(funcmult,jacobian,obj->xopt,obj->M,obj->N,fvec,fjac,obj->ldfjac,obj->Maxfev,diag,obj->mode,
				obj->factor,nprint,obj->eps,obj->ftol,obj->gtol,obj->xtol,&obj->nfev,&obj->njev,ipvt,qtf);
	}
	obj->retval = info;
	obj->Iter = obj->nfev;

	free(fvec);
	free(fjac);
	free(diag);
	free(qtf);
	free(ipvt);

}